

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_ellswift_tests(void)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uchar *ell_b64;
  secp256k1_gej *psVar8;
  uchar *puVar9;
  secp256k1_context *psVar10;
  secp256k1_pubkey *b;
  secp256k1_gej *psVar11;
  uint64_t *extraout_RDX;
  ulong uVar12;
  secp256k1_context *unaff_RBX;
  secp256k1_context *psVar13;
  long lVar14;
  secp256k1_context *output;
  ulong uVar15;
  secp256k1_fe *a;
  secp256k1_context *r;
  ulong uVar16;
  secp256k1_fe *psVar17;
  ulong uVar18;
  code *r_00;
  secp256k1_context *r_01;
  uint uVar19;
  secp256k1_fe *a_00;
  bool bVar20;
  secp256k1_fe sStackY_ee8;
  secp256k1_fe sStackY_eb8;
  secp256k1_context *psStackY_e80;
  secp256k1_fe *psStackY_e78;
  uint uStackY_e6c;
  secp256k1_context *psStackY_e68;
  secp256k1_fe sStackY_e60;
  secp256k1_fe sStackY_e30;
  secp256k1_fe sStackY_e00;
  secp256k1_fe sStackY_dd0;
  secp256k1_fe sStackY_da0;
  secp256k1_fe sStackY_d70;
  secp256k1_fe sStackY_d40;
  secp256k1_fe sStackY_d10;
  secp256k1_context *psStackY_cd8;
  secp256k1_gej *psStackY_cd0;
  secp256k1_context *psStackY_cc8;
  secp256k1_context *psStackY_cc0;
  secp256k1_gej *local_ca0;
  uchar share32_bad [32];
  secp256k1_scalar sec;
  uchar share32 [32];
  uchar sec32 [32];
  uint64_t local_c08;
  uchar sec32b_bad [32];
  uchar share32b [32];
  uchar share32a [32];
  secp256k1_scalar sec_1;
  uchar ell64_1 [64];
  uchar auxrnd32 [32];
  secp256k1_pubkey pubkey_1;
  uchar rnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  uchar ell64 [64];
  secp256k1_fe t;
  secp256k1_context local_758 [4];
  secp256k1_fe x2;
  
  psVar10 = (secp256k1_context *)ellswift_xswiftec_inv_tests[0].encs;
  lVar5 = 0;
  psVar13 = (secp256k1_context *)&t;
  do {
    psVar17 = &ellswift_xswiftec_inv_tests[lVar5].x;
    r_00 = (code *)&ellswift_xswiftec_inv_tests[lVar5].u;
    lVar14 = 0;
    r_01 = psVar10;
    do {
      output = (secp256k1_context *)psVar17;
      r = psVar13;
      iVar3 = secp256k1_ellswift_xswiftec_inv_var
                        ((secp256k1_fe *)psVar13,psVar17,(secp256k1_fe *)r_00,(uint)lVar14);
      uVar7 = iVar3 - (uint)(((uint)ellswift_xswiftec_inv_tests[lVar5].enc_bitmap >>
                              ((uint)lVar14 & 0x1f) & 1) != 0);
      uVar6 = (ulong)uVar7;
      if (uVar7 != 0) {
        run_ellswift_tests_cold_1();
LAB_001237e3:
        run_ellswift_tests_cold_3();
LAB_001237e8:
        run_ellswift_tests_cold_2();
        goto LAB_001237ed;
      }
      if (iVar3 != 0) {
        output = r_01;
        r = psVar13;
        iVar3 = fe_equal((secp256k1_fe *)psVar13,(secp256k1_fe *)r_01);
        uVar7 = (uint)uVar6;
        if (iVar3 == 0) goto LAB_001237e3;
        unaff_RBX = (secp256k1_context *)&x2;
        secp256k1_ellswift_xswiftec_var
                  ((secp256k1_fe *)unaff_RBX,(secp256k1_fe *)r_00,(secp256k1_fe *)r_01);
        output = unaff_RBX;
        r = (secp256k1_context *)psVar17;
        iVar3 = fe_equal(psVar17,(secp256k1_fe *)unaff_RBX);
        uVar7 = (uint)uVar6;
        if (iVar3 != 0) goto LAB_00122afd;
        goto LAB_001237e8;
      }
LAB_00122afd:
      lVar14 = lVar14 + 1;
      r_01 = (secp256k1_context *)((r_01->ecmult_gen_ctx).ge_offset.x.n + 1);
    } while (lVar14 != 8);
    lVar5 = lVar5 + 1;
    psVar10 = (secp256k1_context *)(psVar10[2].ecmult_gen_ctx.scalar_offset.d + 2);
  } while (lVar5 != 0x20);
  unaff_RBX = (secp256k1_context *)&ellswift_decode_tests[0].x;
  r_00 = (code *)0x4c;
  psVar13 = local_758;
  r_01 = (secp256k1_context *)&x2;
  do {
    output = r_01;
    r = CTX;
    iVar3 = secp256k1_ellswift_decode
                      (CTX,(secp256k1_pubkey *)r_01,
                       (uchar *)(unaff_RBX[-1].ecmult_gen_ctx.proj_blind.n + 3));
    uVar7 = (uint)uVar6;
    if (iVar3 == 0) goto LAB_001237ed;
    output = (secp256k1_context *)&t;
    r = CTX;
    iVar3 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)&t,(secp256k1_pubkey *)r_01);
    uVar7 = (uint)uVar6;
    if (iVar3 == 0) goto LAB_001237f2;
    output = (secp256k1_context *)&t;
    r = unaff_RBX;
    iVar3 = fe_equal((secp256k1_fe *)unaff_RBX,&t);
    uVar7 = (uint)uVar6;
    if (iVar3 == 0) goto LAB_001237f7;
    r = psVar13;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    uVar7 = (uint)uVar6;
    if (local_758[0].ecmult_gen_ctx.ge_offset.x.n[0]._4_4_ == 0) goto LAB_001237fc;
    if ((local_758[0].ecmult_gen_ctx.built & 1U) !=
        (uint)(unaff_RBX->ecmult_gen_ctx).ge_offset.x.n[1]) goto LAB_00123801;
    unaff_RBX = (secp256k1_context *)((unaff_RBX->ecmult_gen_ctx).ge_offset.y.n + 4);
    r_00 = (code *)&((secp256k1_gej *)((long)r_00 + -0x98))->field_0x97;
  } while (r_00 != (code *)0x0);
  unaff_RBX = (secp256k1_context *)ellswift_xdh_tests_bip324[0].shared_secret;
  psVar13 = (secp256k1_context *)0x0;
  r_00 = ellswift_xdh_hash_function_bip324;
  do {
    bVar20 = ellswift_xdh_tests_bip324[(long)psVar13].initiating == 0;
    ell_b64 = ellswift_xdh_tests_bip324[(long)psVar13].ellswift_theirs;
    puVar9 = ellswift_xdh_tests_bip324[(long)psVar13].ellswift_ours;
    if (bVar20) {
      ell_b64 = ellswift_xdh_tests_bip324[(long)psVar13].ellswift_ours;
      puVar9 = ellswift_xdh_tests_bip324[(long)psVar13].ellswift_theirs;
    }
    output = (secp256k1_context *)&t;
    psStackY_cc0 = (secp256k1_context *)0x122c25;
    r = CTX;
    iVar3 = secp256k1_ellswift_xdh
                      (CTX,(uchar *)output,puVar9,ell_b64,
                       ellswift_xdh_tests_bip324[(long)psVar13].priv_ours,(uint)bVar20,
                       ellswift_xdh_hash_function_bip324,(void *)0x0);
    uVar7 = (uint)ell_b64;
    if (iVar3 == 0) goto LAB_00123806;
    lVar5 = 0;
    do {
      bVar1 = *(byte *)((long)t.n + lVar5);
      output = (secp256k1_context *)(ulong)bVar1;
      bVar2 = *(byte *)((long)(unaff_RBX->ecmult_gen_ctx).scalar_offset.d + lVar5 + -8);
      r = (secp256k1_context *)(ulong)bVar2;
      iVar3 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00122c58;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    iVar3 = 0;
LAB_00122c58:
    uVar7 = (uint)lVar5;
    if (iVar3 != 0) goto LAB_0012380b;
    psVar13 = (secp256k1_context *)((long)&(psVar13->ecmult_gen_ctx).built + 1);
    unaff_RBX = (secp256k1_context *)((long)&(unaff_RBX->illegal_callback).fn + 4);
  } while (psVar13 != (secp256k1_context *)0x7);
  if (0 < COUNT) {
    psVar13 = (secp256k1_context *)0x0;
    unaff_RBX = (secp256k1_context *)&t;
    do {
      testutil_random_ge_test((secp256k1_ge *)unaff_RBX);
      secp256k1_ge_to_bytes(pubkey_1.data,(secp256k1_ge *)unaff_RBX);
      r_00 = (code *)rnd32;
      testrand256((uchar *)r_00);
      r_01 = (secp256k1_context *)ell64;
      psVar8 = (secp256k1_gej *)r_00;
      secp256k1_ellswift_encode(CTX,(uchar *)r_01,&pubkey_1,(uchar *)r_00);
      uVar7 = (uint)psVar8;
      secp256k1_ellswift_decode(CTX,&pubkey2,(uchar *)r_01);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)&x2,&pubkey2);
      output = (secp256k1_context *)&x2;
      r = unaff_RBX;
      iVar3 = secp256k1_ge_eq_var((secp256k1_ge *)unaff_RBX,(secp256k1_ge *)&x2);
      if (iVar3 == 0) goto LAB_00123810;
      uVar7 = (int)psVar13 + 1;
      psVar13 = (secp256k1_context *)(ulong)uVar7;
    } while (SBORROW4(uVar7,COUNT * 1000) != (int)(uVar7 + COUNT * -1000) < 0);
  }
  if (0 < COUNT) {
    r_00 = (code *)0x0;
    unaff_RBX = (secp256k1_context *)&sec;
    psVar13 = (secp256k1_context *)&pubkey_1;
    do {
      if (((ulong)r_00 & 1) == 0) {
        puVar9 = (uchar *)0x0;
      }
      else {
        puVar9 = auxrnd32;
        testrand_bytes_test(puVar9,0x20);
      }
      testutil_random_scalar_order_test((secp256k1_scalar *)unaff_RBX);
      r_01 = (secp256k1_context *)sec32;
      secp256k1_scalar_get_b32((uchar *)r_01,(secp256k1_scalar *)unaff_RBX);
      output = (secp256k1_context *)ell64_1;
      r = CTX;
      iVar3 = secp256k1_ellswift_create(CTX,ell64_1,(uchar *)r_01,puVar9);
      uVar7 = (uint)puVar9;
      if (iVar3 == 0) goto LAB_00123815;
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)rnd32,ell64_1);
      r_01 = (secp256k1_context *)&pubkey2;
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)r_01,(secp256k1_pubkey *)rnd32);
      share32._0_8_ = ell64;
      share32._8_8_ = &x2;
      share32._16_8_ = &t;
      uVar7 = 0;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)share32,(secp256k1_gej *)psVar13,1,(secp256k1_gej *)0x0,
                 &secp256k1_scalar_zero,(secp256k1_scalar *)unaff_RBX);
      output = r_01;
      r = psVar13;
      iVar3 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar13,(secp256k1_ge *)r_01);
      if (iVar3 == 0) goto LAB_0012381a;
      uVar7 = (int)r_00 + 1;
      r_00 = (code *)(ulong)uVar7;
    } while (SBORROW4(uVar7,COUNT * 400) != (int)(uVar7 + COUNT * -400) < 0);
  }
  if (0 < COUNT) {
    psVar13 = (secp256k1_context *)0x0;
    r_01 = (secp256k1_context *)&pubkey_1;
    do {
      testutil_random_scalar_order_test(&sec_1);
      secp256k1_scalar_get_b32((uchar *)&sec,&sec_1);
      puVar9 = ell64_1;
      testrand_bytes_test(puVar9,0x20);
      testrand_bytes_test(ell64_1 + 0x20,0x20);
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)auxrnd32,puVar9);
      r_00 = (code *)rnd32;
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)r_00,(secp256k1_pubkey *)auxrnd32);
      secp256k1_gej_set_ge((secp256k1_gej *)r_01,(secp256k1_ge *)r_00);
      uVar19 = (uint)psVar13;
      psStackY_cc0 = (secp256k1_context *)0x122f2c;
      output = (secp256k1_context *)share32;
      r = CTX;
      iVar3 = secp256k1_ellswift_xdh
                        (CTX,share32,puVar9,puVar9,(uchar *)&sec,uVar19 & 1,ellswift_xdh_hash_x32,
                         (void *)0x0);
      uVar7 = (uint)puVar9;
      unaff_RBX = (secp256k1_context *)share32;
      if (iVar3 == 0) goto LAB_0012381f;
      psVar13 = (secp256k1_context *)sec32;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar13,share32);
      if ((((ulong)sec32._0_8_ < 0xffffefffffc2f) || (local_c08 != 0xffffffffffff)) ||
         ((sec32._16_8_ & sec32._24_8_ & sec32._8_8_) != 0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)psVar13);
      }
      unaff_RBX = (secp256k1_context *)&sec_1;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      sec32b_bad._0_8_ = ell64;
      sec32b_bad._8_8_ = &x2;
      r = (secp256k1_context *)&t;
      r_00 = (code *)&pubkey2;
      psVar10 = r_01;
      sec32b_bad._16_8_ = r;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)sec32b_bad,(secp256k1_gej *)r_00,1,(secp256k1_gej *)r_01
                 ,(secp256k1_scalar *)unaff_RBX,(secp256k1_scalar *)0x0);
      uVar7 = (uint)psVar10;
      secp256k1_ge_set_gej((secp256k1_ge *)r,(secp256k1_gej *)r_00);
      output = psVar13;
      iVar3 = fe_equal((secp256k1_fe *)r,(secp256k1_fe *)psVar13);
      if (iVar3 == 0) goto LAB_00123824;
      uVar19 = uVar19 + 1;
      psVar13 = (secp256k1_context *)(ulong)uVar19;
    } while (SBORROW4(uVar19,COUNT * 800) != (int)(uVar19 + COUNT * -800) < 0);
  }
  if (0 < COUNT) {
    uVar6 = 0;
    do {
      iVar3 = (int)uVar6 + (int)(uVar6 / 3) * -3;
      if (iVar3 == 0) {
        local_ca0 = (secp256k1_gej *)ellswift_xdh_hash_x32;
LAB_001230a5:
        unaff_RBX = (secp256k1_context *)0x0;
      }
      else {
        if (iVar3 == 1) {
          local_ca0 = (secp256k1_gej *)ellswift_xdh_hash_function_bip324;
          goto LAB_001230a5;
        }
        unaff_RBX = (secp256k1_context *)&pubkey2;
        testrand_bytes_test((uchar *)unaff_RBX,0x20);
        testrand_bytes_test(pubkey2.data + 0x20,0x20);
        local_ca0 = (secp256k1_gej *)ellswift_xdh_hash_function_prefix;
      }
      psVar13 = (secp256k1_context *)rnd32;
      testrand_bytes_test((uchar *)psVar13,0x20);
      puVar9 = ell64_1;
      testrand_bytes_test(puVar9,0x20);
      testutil_random_scalar_order_test(&seca);
      testutil_random_scalar_order(&secb);
      r_00 = (code *)&sec;
      secp256k1_scalar_get_b32((uchar *)r_00,&seca);
      r_01 = (secp256k1_context *)share32;
      secp256k1_scalar_get_b32((uchar *)r_01,&secb);
      psVar10 = psVar13;
      output = (secp256k1_context *)&t;
      r = CTX;
      iVar4 = secp256k1_ellswift_create(CTX,(uchar *)&t,(uchar *)r_00,(uchar *)psVar13);
      uVar7 = (uint)psVar10;
      if (iVar4 == 0) goto LAB_00123829;
      psVar13 = (secp256k1_context *)&x2;
      output = psVar13;
      r = CTX;
      iVar4 = secp256k1_ellswift_create(CTX,(uchar *)psVar13,(uchar *)r_01,puVar9);
      uVar7 = (uint)puVar9;
      if (iVar4 == 0) goto LAB_0012382e;
      output = (secp256k1_context *)share32a;
      psStackY_cc0 = (secp256k1_context *)0x1231bf;
      psVar10 = psVar13;
      r = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,(uchar *)psVar13,(uchar *)&sec,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      uVar7 = (uint)psVar10;
      if (iVar4 == 0) goto LAB_00123833;
      output = (secp256k1_context *)share32b;
      psStackY_cc0 = (secp256k1_context *)0x1231f1;
      psVar10 = psVar13;
      r = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,(uchar *)psVar13,(uchar *)r_01,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      uVar7 = (uint)psVar10;
      if (iVar4 == 0) goto LAB_00123838;
      lVar5 = 0;
      b = &pubkey_1;
      do {
        bVar1 = share32a[lVar5];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar5];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar4 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00123230;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar4 = 0;
LAB_00123230:
      uVar7 = (uint)lVar5;
      if (iVar4 != 0) goto LAB_0012383d;
      pubkey_1.data[0x20] = (undefined1)x2.n[4];
      pubkey_1.data[0x21] = x2.n[4]._1_1_;
      pubkey_1.data[0x22] = x2.n[4]._2_1_;
      pubkey_1.data[0x23] = x2.n[4]._3_1_;
      pubkey_1.data[0x24] = x2.n[4]._4_1_;
      pubkey_1.data[0x25] = x2.n[4]._5_1_;
      pubkey_1.data[0x26] = x2.n[4]._6_1_;
      pubkey_1.data[0x27] = x2.n[4]._7_1_;
      pubkey_1.data._40_8_ = x2._40_8_;
      pubkey_1.data[0x10] = (undefined1)x2.n[2];
      pubkey_1.data[0x11] = x2.n[2]._1_1_;
      pubkey_1.data[0x12] = x2.n[2]._2_1_;
      pubkey_1.data[0x13] = x2.n[2]._3_1_;
      pubkey_1.data[0x14] = x2.n[2]._4_1_;
      pubkey_1.data[0x15] = x2.n[2]._5_1_;
      pubkey_1.data[0x16] = x2.n[2]._6_1_;
      pubkey_1.data[0x17] = x2.n[2]._7_1_;
      pubkey_1.data[0x18] = (undefined1)x2.n[3];
      pubkey_1.data[0x19] = x2.n[3]._1_1_;
      pubkey_1.data[0x1a] = x2.n[3]._2_1_;
      pubkey_1.data[0x1b] = x2.n[3]._3_1_;
      pubkey_1.data[0x1c] = x2.n[3]._4_1_;
      pubkey_1.data[0x1d] = x2.n[3]._5_1_;
      pubkey_1.data[0x1e] = x2.n[3]._6_1_;
      pubkey_1.data[0x1f] = x2.n[3]._7_1_;
      pubkey_1.data[0] = (undefined1)x2.n[0];
      pubkey_1.data[1] = x2.n[0]._1_1_;
      pubkey_1.data[2] = x2.n[0]._2_1_;
      pubkey_1.data[3] = x2.n[0]._3_1_;
      pubkey_1.data[4] = x2.n[0]._4_1_;
      pubkey_1.data[5] = x2.n[0]._5_1_;
      pubkey_1.data[6] = x2.n[0]._6_1_;
      pubkey_1.data[7] = x2.n[0]._7_1_;
      pubkey_1.data[8] = (undefined1)x2.n[1];
      pubkey_1.data[9] = x2.n[1]._1_1_;
      pubkey_1.data[10] = x2.n[1]._2_1_;
      pubkey_1.data[0xb] = x2.n[1]._3_1_;
      pubkey_1.data[0xc] = x2.n[1]._4_1_;
      pubkey_1.data[0xd] = x2.n[1]._5_1_;
      pubkey_1.data[0xe] = x2.n[1]._6_1_;
      pubkey_1.data[0xf] = x2.n[1]._7_1_;
      testrand_flip(b->data,0x40);
      output = (secp256k1_context *)share32_bad;
      psStackY_cc0 = (secp256k1_context *)0x1232a7;
      r = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,(uchar *)&t,b->data,(uchar *)&sec,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      uVar7 = (uint)b;
      if (iVar4 == 0) goto LAB_00123842;
      lVar5 = 0;
      do {
        bVar1 = share32_bad[lVar5];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32a[lVar5];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar4 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_001232db;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar4 = 0;
LAB_001232db:
      uVar7 = (uint)lVar5;
      if (iVar4 == 0) goto LAB_00123847;
      ell64[0x38] = (undefined1)local_758[0].ecmult_gen_ctx.scalar_offset.d[0];
      ell64[0x39] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._1_1_;
      ell64[0x3a] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._2_1_;
      ell64[0x3b] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._3_1_;
      ell64[0x3c] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._4_1_;
      ell64[0x3d] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._5_1_;
      ell64[0x3e] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._6_1_;
      ell64[0x3f] = local_758[0].ecmult_gen_ctx.scalar_offset.d[0]._7_1_;
      ell64[0x20] = (undefined1)t.n[4];
      ell64[0x21] = t.n[4]._1_1_;
      ell64[0x22] = t.n[4]._2_1_;
      ell64[0x23] = t.n[4]._3_1_;
      ell64[0x24] = t.n[4]._4_1_;
      ell64[0x25] = t.n[4]._5_1_;
      ell64[0x26] = t.n[4]._6_1_;
      ell64[0x27] = t.n[4]._7_1_;
      ell64._40_8_ = t._40_8_;
      ell64[0x10] = (undefined1)t.n[2];
      ell64[0x11] = t.n[2]._1_1_;
      ell64[0x12] = t.n[2]._2_1_;
      ell64[0x13] = t.n[2]._3_1_;
      ell64[0x14] = t.n[2]._4_1_;
      ell64[0x15] = t.n[2]._5_1_;
      ell64[0x16] = t.n[2]._6_1_;
      ell64[0x17] = t.n[2]._7_1_;
      ell64[0x18] = (undefined1)t.n[3];
      ell64[0x19] = t.n[3]._1_1_;
      ell64[0x1a] = t.n[3]._2_1_;
      ell64[0x1b] = t.n[3]._3_1_;
      ell64[0x1c] = t.n[3]._4_1_;
      ell64[0x1d] = t.n[3]._5_1_;
      ell64[0x1e] = t.n[3]._6_1_;
      ell64[0x1f] = t.n[3]._7_1_;
      ell64[0] = (undefined1)t.n[0];
      ell64[1] = t.n[0]._1_1_;
      ell64[2] = t.n[0]._2_1_;
      ell64[3] = t.n[0]._3_1_;
      ell64[4] = t.n[0]._4_1_;
      ell64[5] = t.n[0]._5_1_;
      ell64[6] = t.n[0]._6_1_;
      ell64[7] = t.n[0]._7_1_;
      ell64[8] = (undefined1)t.n[1];
      ell64[9] = t.n[1]._1_1_;
      ell64[10] = t.n[1]._2_1_;
      ell64[0xb] = t.n[1]._3_1_;
      ell64[0xc] = t.n[1]._4_1_;
      ell64[0xd] = t.n[1]._5_1_;
      ell64[0xe] = t.n[1]._6_1_;
      ell64[0xf] = t.n[1]._7_1_;
      testrand_flip(ell64,0x40);
      output = (secp256k1_context *)share32_bad;
      psStackY_cc0 = (secp256k1_context *)0x12335b;
      psVar10 = psVar13;
      r = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)output,ell64,(uchar *)psVar13,(uchar *)r_01,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      uVar7 = (uint)psVar10;
      if (iVar4 == 0) goto LAB_0012384c;
      lVar5 = 0;
      do {
        bVar1 = share32_bad[lVar5];
        output = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar5];
        r = (secp256k1_context *)(ulong)bVar2;
        iVar4 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_0012338f;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      iVar4 = 0;
LAB_0012338f:
      uVar7 = (uint)lVar5;
      if (iVar4 == 0) goto LAB_00123851;
      sec_1.d[2] = sec.d[2];
      sec_1.d[3] = sec.d[3];
      sec_1.d[0] = sec.d[0];
      sec_1.d[1] = sec.d[1];
      testrand_flip((uchar *)&sec_1,0x20);
      psStackY_cc0 = (secp256k1_context *)0x1233e6;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)psVar13,(uchar *)&sec_1,0,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      if (iVar4 != 0) {
        lVar5 = 0;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00123416;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar4 = 0;
LAB_00123416:
        uVar7 = (uint)lVar5;
        if (iVar4 == 0) goto LAB_00123856;
      }
      sec32b_bad[0x10] = share32[0x10];
      sec32b_bad[0x11] = share32[0x11];
      sec32b_bad[0x12] = share32[0x12];
      sec32b_bad[0x13] = share32[0x13];
      sec32b_bad[0x14] = share32[0x14];
      sec32b_bad[0x15] = share32[0x15];
      sec32b_bad[0x16] = share32[0x16];
      sec32b_bad[0x17] = share32[0x17];
      sec32b_bad[0x18] = share32[0x18];
      sec32b_bad[0x19] = share32[0x19];
      sec32b_bad[0x1a] = share32[0x1a];
      sec32b_bad[0x1b] = share32[0x1b];
      sec32b_bad[0x1c] = share32[0x1c];
      sec32b_bad[0x1d] = share32[0x1d];
      sec32b_bad[0x1e] = share32[0x1e];
      sec32b_bad[0x1f] = share32[0x1f];
      sec32b_bad[0] = share32[0];
      sec32b_bad[1] = share32[1];
      sec32b_bad[2] = share32[2];
      sec32b_bad[3] = share32[3];
      sec32b_bad[4] = share32[4];
      sec32b_bad[5] = share32[5];
      sec32b_bad[6] = share32[6];
      sec32b_bad[7] = share32[7];
      sec32b_bad[8] = share32[8];
      sec32b_bad[9] = share32[9];
      sec32b_bad[10] = share32[10];
      sec32b_bad[0xb] = share32[0xb];
      sec32b_bad[0xc] = share32[0xc];
      sec32b_bad[0xd] = share32[0xd];
      sec32b_bad[0xe] = share32[0xe];
      sec32b_bad[0xf] = share32[0xf];
      testrand_flip(sec32b_bad,0x20);
      psStackY_cc0 = (secp256k1_context *)0x123470;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)psVar13,sec32b_bad,1,
                         (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
      if (iVar4 != 0) {
        lVar5 = 0;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_001234a0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar4 = 0;
LAB_001234a0:
        uVar7 = (uint)lVar5;
        if (iVar4 == 0) goto LAB_0012385b;
      }
      if (iVar3 != 0) {
        sec32[0x10] = ell64_1[0x10];
        sec32[0x11] = ell64_1[0x11];
        sec32[0x12] = ell64_1[0x12];
        sec32[0x13] = ell64_1[0x13];
        sec32[0x14] = ell64_1[0x14];
        sec32[0x15] = ell64_1[0x15];
        sec32[0x16] = ell64_1[0x16];
        sec32[0x17] = ell64_1[0x17];
        sec32[0x18] = ell64_1[0x18];
        sec32[0x19] = ell64_1[0x19];
        sec32[0x1a] = ell64_1[0x1a];
        sec32[0x1b] = ell64_1[0x1b];
        sec32[0x1c] = ell64_1[0x1c];
        sec32[0x1d] = ell64_1[0x1d];
        sec32[0x1e] = ell64_1[0x1e];
        sec32[0x1f] = ell64_1[0x1f];
        sec32[0] = ell64_1[0];
        sec32[1] = ell64_1[1];
        sec32[2] = ell64_1[2];
        sec32[3] = ell64_1[3];
        sec32[4] = ell64_1[4];
        sec32[5] = ell64_1[5];
        sec32[6] = ell64_1[6];
        sec32[7] = ell64_1[7];
        sec32[8] = ell64_1[8];
        sec32[9] = ell64_1[9];
        sec32[10] = ell64_1[10];
        sec32[0xb] = ell64_1[0xb];
        sec32[0xc] = ell64_1[0xc];
        sec32[0xd] = ell64_1[0xd];
        sec32[0xe] = ell64_1[0xe];
        sec32[0xf] = ell64_1[0xf];
        puVar9 = sec32;
        testrand_flip(puVar9,0x20);
        r_01 = (secp256k1_context *)&pubkey_1;
        output = r_01;
        r = CTX;
        iVar3 = secp256k1_ellswift_create(CTX,(uchar *)r_01,share32,puVar9);
        uVar7 = (uint)puVar9;
        if (iVar3 == 0) goto LAB_00123860;
        output = (secp256k1_context *)share32_bad;
        psStackY_cc0 = (secp256k1_context *)0x123531;
        psVar10 = r_01;
        r = CTX;
        iVar3 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)r_01,(uchar *)&sec,0,
                           (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
        uVar7 = (uint)psVar10;
        if (iVar3 == 0) goto LAB_00123865;
        lVar5 = 0;
        r_01 = (secp256k1_context *)share32;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar3 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00123572;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar3 = 0;
LAB_00123572:
        uVar7 = (uint)lVar5;
        psVar8 = local_ca0;
        if (iVar3 == 0) goto LAB_0012386a;
        auxrnd32[0x10] = rnd32[0x10];
        auxrnd32[0x11] = rnd32[0x11];
        auxrnd32[0x12] = rnd32[0x12];
        auxrnd32[0x13] = rnd32[0x13];
        auxrnd32[0x14] = rnd32[0x14];
        auxrnd32[0x15] = rnd32[0x15];
        auxrnd32[0x16] = rnd32[0x16];
        auxrnd32[0x17] = rnd32[0x17];
        auxrnd32[0x18] = rnd32[0x18];
        auxrnd32[0x19] = rnd32[0x19];
        auxrnd32[0x1a] = rnd32[0x1a];
        auxrnd32[0x1b] = rnd32[0x1b];
        auxrnd32[0x1c] = rnd32[0x1c];
        auxrnd32[0x1d] = rnd32[0x1d];
        auxrnd32[0x1e] = rnd32[0x1e];
        auxrnd32[0x1f] = rnd32[0x1f];
        auxrnd32[0] = rnd32[0];
        auxrnd32[1] = rnd32[1];
        auxrnd32[2] = rnd32[2];
        auxrnd32[3] = rnd32[3];
        auxrnd32[4] = rnd32[4];
        auxrnd32[5] = rnd32[5];
        auxrnd32[6] = rnd32[6];
        auxrnd32[7] = rnd32[7];
        auxrnd32[8] = rnd32[8];
        auxrnd32[9] = rnd32[9];
        auxrnd32[10] = rnd32[10];
        auxrnd32[0xb] = rnd32[0xb];
        auxrnd32[0xc] = rnd32[0xc];
        auxrnd32[0xd] = rnd32[0xd];
        auxrnd32[0xe] = rnd32[0xe];
        auxrnd32[0xf] = rnd32[0xf];
        psVar8 = (secp256k1_gej *)auxrnd32;
        testrand_flip((uchar *)psVar8,0x20);
        psVar11 = psVar8;
        output = (secp256k1_context *)ell64;
        r = CTX;
        iVar3 = secp256k1_ellswift_create(CTX,ell64,(uchar *)&sec,(uchar *)psVar8);
        uVar7 = (uint)psVar11;
        if (iVar3 == 0) goto LAB_0012386f;
        output = (secp256k1_context *)share32_bad;
        psStackY_cc0 = (secp256k1_context *)0x1235f6;
        psVar10 = psVar13;
        r = CTX;
        iVar3 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,ell64,(uchar *)psVar13,(uchar *)r_01,1,
                           (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
        uVar7 = (uint)psVar10;
        if (iVar3 == 0) goto LAB_00123874;
        lVar5 = 0;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar3 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_0012362a;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar3 = 0;
LAB_0012362a:
        uVar7 = (uint)lVar5;
        if (iVar3 == 0) goto LAB_00123879;
        output = (secp256k1_context *)share32_bad;
        psStackY_cc0 = (secp256k1_context *)0x123657;
        psVar10 = psVar13;
        r = CTX;
        iVar3 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)psVar13,(uchar *)&sec,1,
                           (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
        uVar7 = (uint)psVar10;
        if (iVar3 == 0) goto LAB_0012387e;
        lVar5 = 0;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar3 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_0012368b;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar3 = 0;
LAB_0012368b:
        uVar7 = (uint)lVar5;
        if (iVar3 == 0) goto LAB_00123883;
        output = (secp256k1_context *)share32_bad;
        psStackY_cc0 = (secp256k1_context *)0x1236b3;
        psVar10 = psVar13;
        r = CTX;
        iVar3 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)output,(uchar *)&t,(uchar *)psVar13,(uchar *)r_01,0,
                           (secp256k1_ellswift_xdh_hash_function)local_ca0,unaff_RBX);
        uVar7 = (uint)psVar10;
        if (iVar3 == 0) goto LAB_00123888;
        lVar5 = 0;
        do {
          bVar1 = share32_bad[lVar5];
          output = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar5];
          r = (secp256k1_context *)(ulong)bVar2;
          iVar3 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_001236e7;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        iVar3 = 0;
LAB_001236e7:
        uVar7 = (uint)lVar5;
        if (iVar3 == 0) goto LAB_0012388d;
      }
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
    } while (SBORROW4(uVar7,COUNT * 200) != (int)(uVar7 + COUNT * -200) < 0);
  }
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_encode",0x19);
  x2.n[0] = 0x28594b3d1a6524b;
  x2.n[1] = 0x1037a17796e42f4e;
  x2.n[2] = 0x560238851b8fcb8b;
  x2.n[3] = 0xd626b7152560ede1;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_create",0x19);
  x2.n[0] = 0xf7025f42d29e1bf5;
  x2.n[1] = 0x94cb7d59b024773;
  x2.n[2] = 0x3bc9786e59ed789;
  x2.n[3] = 0x4e363b5368335b35;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"bip324_ellswift_xonly_ecdh",0x1a);
  x2.n[0] = 0x827bd3928c12d730;
  x2.n[1] = 0x207b373e9e4fb2ee;
  x2.n[2] = 0xaa5441bc2292bd7a;
  x2.n[3] = 0xcfb5254915c3779f;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  return;
LAB_001237ed:
  run_ellswift_tests_cold_36();
LAB_001237f2:
  run_ellswift_tests_cold_35();
LAB_001237f7:
  run_ellswift_tests_cold_34();
LAB_001237fc:
  run_ellswift_tests_cold_33();
LAB_00123801:
  run_ellswift_tests_cold_4();
LAB_00123806:
  run_ellswift_tests_cold_32();
LAB_0012380b:
  run_ellswift_tests_cold_5();
LAB_00123810:
  run_ellswift_tests_cold_31();
LAB_00123815:
  run_ellswift_tests_cold_30();
LAB_0012381a:
  run_ellswift_tests_cold_29();
LAB_0012381f:
  run_ellswift_tests_cold_28();
LAB_00123824:
  run_ellswift_tests_cold_27();
LAB_00123829:
  run_ellswift_tests_cold_26();
LAB_0012382e:
  local_ca0 = (secp256k1_gej *)r_00;
  run_ellswift_tests_cold_25();
LAB_00123833:
  run_ellswift_tests_cold_24();
LAB_00123838:
  run_ellswift_tests_cold_23();
LAB_0012383d:
  run_ellswift_tests_cold_6();
LAB_00123842:
  run_ellswift_tests_cold_22();
LAB_00123847:
  run_ellswift_tests_cold_21();
LAB_0012384c:
  run_ellswift_tests_cold_20();
LAB_00123851:
  run_ellswift_tests_cold_19();
LAB_00123856:
  run_ellswift_tests_cold_7();
LAB_0012385b:
  run_ellswift_tests_cold_8();
LAB_00123860:
  run_ellswift_tests_cold_18();
LAB_00123865:
  run_ellswift_tests_cold_17();
  psVar8 = local_ca0;
LAB_0012386a:
  run_ellswift_tests_cold_16();
LAB_0012386f:
  run_ellswift_tests_cold_15();
LAB_00123874:
  run_ellswift_tests_cold_14();
LAB_00123879:
  run_ellswift_tests_cold_13();
LAB_0012387e:
  run_ellswift_tests_cold_12();
LAB_00123883:
  run_ellswift_tests_cold_11();
LAB_00123888:
  run_ellswift_tests_cold_10();
LAB_0012388d:
  run_ellswift_tests_cold_9();
  psStackY_cc0 = psVar13;
  psStackY_cc8 = r_01;
  psStackY_cd0 = psVar8;
  psStackY_cd8 = unaff_RBX;
  sStackY_e00.n[0] = *(uint64_t *)&output->ecmult_gen_ctx;
  sStackY_e00.n[1] = (output->ecmult_gen_ctx).scalar_offset.d[0];
  sStackY_e00.n[2] = (output->ecmult_gen_ctx).scalar_offset.d[1];
  sStackY_e00.n[3] = (output->ecmult_gen_ctx).scalar_offset.d[2];
  sStackY_e00.n[4] = (output->ecmult_gen_ctx).scalar_offset.d[3];
  sStackY_e00._40_8_ = (output->ecmult_gen_ctx).ge_offset.x.n[0];
  sStackY_dd0.n[0] = *extraout_RDX;
  sStackY_dd0.n[1] = extraout_RDX[1];
  sStackY_dd0.n[2] = extraout_RDX[2];
  sStackY_dd0.n[3] = extraout_RDX[3];
  sStackY_dd0.n[4] = extraout_RDX[4];
  sStackY_dd0._40_8_ = extraout_RDX[5];
  a_00 = &sStackY_dd0;
  psStackY_e78 = (secp256k1_fe *)0x123911;
  uStackY_e6c = uVar7;
  psStackY_e68 = r;
  secp256k1_fe_verify(&sStackY_e00);
  uVar6 = (sStackY_e00.n[4] >> 0x30) * 0x1000003d1 + sStackY_e00.n[0];
  uVar12 = (uVar6 >> 0x34) + sStackY_e00.n[1];
  uVar15 = (uVar12 >> 0x34) + sStackY_e00.n[2];
  uVar16 = (uVar15 >> 0x34) + sStackY_e00.n[3];
  sStackY_e00.n[3] = uVar16 & 0xfffffffffffff;
  sStackY_e00.n[4] = (uVar16 >> 0x34) + (sStackY_e00.n[4] & 0xffffffffffff);
  sStackY_e00.n[2] = uVar15 & 0xfffffffffffff;
  sStackY_e00.n[1] = uVar12 & 0xfffffffffffff;
  sStackY_e00.n[0] = uVar6 & 0xfffffffffffff;
  psVar13 = (secp256k1_context *)0x1;
  sStackY_e00.magnitude = 1;
  psStackY_e78 = (secp256k1_fe *)0x123981;
  secp256k1_fe_verify(&sStackY_e00);
  psStackY_e78 = (secp256k1_fe *)0x123989;
  secp256k1_fe_verify(a_00);
  uVar7 = uStackY_e6c;
  uVar6 = (sStackY_dd0.n[4] >> 0x30) * 0x1000003d1 + sStackY_dd0.n[0];
  uVar12 = (uVar6 >> 0x34) + sStackY_dd0.n[1];
  uVar15 = (uVar12 >> 0x34) + sStackY_dd0.n[2];
  uVar16 = (uVar15 >> 0x34) + sStackY_dd0.n[3];
  sStackY_dd0.n[3] = uVar16 & 0xfffffffffffff;
  sStackY_dd0.n[4] = (uVar16 >> 0x34) + (sStackY_dd0.n[4] & 0xffffffffffff);
  a = (secp256k1_fe *)(uVar15 & 0xfffffffffffff);
  sStackY_dd0.n[1] = uVar12 & 0xfffffffffffff;
  sStackY_dd0.n[0] = uVar6 & 0xfffffffffffff;
  sStackY_dd0.magnitude = 1;
  psStackY_e78 = (secp256k1_fe *)0x1239f9;
  psVar17 = a_00;
  sStackY_dd0.n[2] = (uint64_t)a;
  secp256k1_fe_verify(a_00);
  if ((int)uVar7 < 0) {
    psStackY_e78 = (secp256k1_fe *)0x124478;
    secp256k1_ellswift_xswiftec_inv_var_cold_13();
LAB_00124478:
    psStackY_e78 = (secp256k1_fe *)0x12447d;
    secp256k1_ellswift_xswiftec_inv_var_cold_12();
LAB_0012447d:
    psStackY_e78 = (secp256k1_fe *)0x124482;
    secp256k1_ellswift_xswiftec_inv_var_cold_11();
LAB_00124482:
    psStackY_e78 = (secp256k1_fe *)0x124487;
    secp256k1_ellswift_xswiftec_inv_var_cold_6();
LAB_00124487:
    psStackY_e78 = (secp256k1_fe *)0x12448c;
    secp256k1_ellswift_xswiftec_inv_var_cold_5();
LAB_0012448c:
    psStackY_e78 = (secp256k1_fe *)0x124491;
    secp256k1_ellswift_xswiftec_inv_var_cold_4();
LAB_00124491:
    psStackY_e78 = (secp256k1_fe *)0x124496;
    secp256k1_ellswift_xswiftec_inv_var_cold_3();
LAB_00124496:
    psStackY_e78 = (secp256k1_fe *)0x12449b;
    secp256k1_ellswift_xswiftec_inv_var_cold_9();
LAB_0012449b:
    psStackY_e78 = (secp256k1_fe *)0x1244a0;
    secp256k1_ellswift_xswiftec_inv_var_cold_8();
LAB_001244a0:
    psStackY_e78 = (secp256k1_fe *)0x1244a5;
    secp256k1_ellswift_xswiftec_inv_var_cold_2();
LAB_001244a5:
    psStackY_e78 = (secp256k1_fe *)0x1244aa;
    secp256k1_ellswift_xswiftec_inv_var_cold_1();
  }
  else {
    psVar17 = &sStackY_e00;
    psStackY_e78 = (secp256k1_fe *)0x123a0c;
    iVar3 = secp256k1_ge_x_on_curve_var(psVar17);
    if (iVar3 == 0) goto LAB_00124478;
    if ((uVar7 & 2) != 0) {
      psVar13 = (secp256k1_context *)0x3fffffffffffc;
      psStackY_e78 = (secp256k1_fe *)0x123dbb;
      secp256k1_fe_verify(&sStackY_dd0);
      a = (secp256k1_fe *)0x1;
      psStackY_e78 = (secp256k1_fe *)0x123dc8;
      secp256k1_fe_verify_magnitude(&sStackY_dd0,1);
      sStackY_e30.n[0] = 0x3ffffbfffff0bc - sStackY_dd0.n[0];
      sStackY_e30.n[1] = 0x3ffffffffffffc - sStackY_dd0.n[1];
      sStackY_e30.n[2] = 0x3ffffffffffffc - sStackY_dd0.n[2];
      sStackY_e30.n[3] = 0x3ffffffffffffc - sStackY_dd0.n[3];
      sStackY_e30.n[4] = 0x3fffffffffffc - sStackY_dd0.n[4];
      sStackY_e30.magnitude = 2;
      sStackY_e30.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x123e0e;
      secp256k1_fe_verify(&sStackY_e30);
      a_00 = &sStackY_e60;
      sStackY_e60.n[4] = sStackY_e30.n[4];
      sStackY_e60.magnitude = sStackY_e30.magnitude;
      sStackY_e60.normalized = sStackY_e30.normalized;
      sStackY_e60.n[2] = sStackY_e30.n[2];
      sStackY_e60.n[3] = sStackY_e30.n[3];
      sStackY_e60.n[0] = sStackY_e30.n[0];
      sStackY_e60.n[1] = sStackY_e30.n[1];
      psStackY_e78 = (secp256k1_fe *)0x123e37;
      secp256k1_fe_verify(a_00);
      psVar17 = &sStackY_e00;
      psStackY_e78 = (secp256k1_fe *)0x123e44;
      secp256k1_fe_verify(psVar17);
      if (0x20 < sStackY_e00.magnitude + sStackY_e60.magnitude) goto LAB_00124482;
      sStackY_e60.n[0] = sStackY_e60.n[0] + sStackY_e00.n[0];
      sStackY_e60.n[1] = sStackY_e60.n[1] + sStackY_e00.n[1];
      sStackY_e60.n[2] = sStackY_e60.n[2] + sStackY_e00.n[2];
      sStackY_e60.n[3] = sStackY_e60.n[3] + sStackY_e00.n[3];
      sStackY_e60.n[4] = sStackY_e60.n[4] + sStackY_e00.n[4];
      sStackY_e60.normalized = 0;
      sStackY_e60.magnitude = sStackY_e00.magnitude + sStackY_e60.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x123e9f;
      secp256k1_fe_verify(&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x123ea7;
      iVar3 = secp256k1_fe_is_square_var(&sStackY_e60);
      if (iVar3 == 0) {
        return;
      }
      a_00 = &sStackY_d70;
      psStackY_e78 = (secp256k1_fe *)0x123ec7;
      secp256k1_fe_sqr(a_00,&sStackY_dd0);
      psVar17 = &sStackY_d10;
      a = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x123edf;
      secp256k1_fe_mul(psVar17,a,a_00);
      psStackY_e78 = (secp256k1_fe *)0x123ee7;
      secp256k1_fe_verify(psVar17);
      if (10 < sStackY_d10.magnitude) goto LAB_00124487;
      sStackY_d10.n[0] = sStackY_d10.n[0] * 3;
      sStackY_d10.n[1] = sStackY_d10.n[1] * 3;
      sStackY_d10.n[2] = sStackY_d10.n[2] * 3;
      sStackY_d10.n[3] = sStackY_d10.n[3] * 3;
      sStackY_d10.n[4] = sStackY_d10.n[4] * 3;
      sStackY_d10.normalized = 0;
      sStackY_d10.magnitude = sStackY_d10.magnitude * 3;
      psStackY_e78 = (secp256k1_fe *)0x123f48;
      secp256k1_fe_verify(&sStackY_d10);
      a_00 = &sStackY_d70;
      psStackY_e78 = (secp256k1_fe *)0x123f63;
      a = a_00;
      secp256k1_fe_mul(a_00,a_00,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x123f6b;
      psVar17 = a_00;
      secp256k1_fe_verify(a_00);
      if (8 < sStackY_d70.magnitude) goto LAB_0012448c;
      psVar17 = &sStackY_d70;
      sStackY_d70.n[0] = sStackY_d70.n[0] << 2;
      sStackY_d70.n[1] = sStackY_d70.n[1] << 2;
      sStackY_d70.n[2] = sStackY_d70.n[2] << 2;
      sStackY_d70.n[3] = sStackY_d70.n[3] << 2;
      sStackY_d70.n[4] = sStackY_d70.n[4] << 2;
      sStackY_d70.magnitude = sStackY_d70.magnitude << 2;
      a_00 = (secp256k1_fe *)0x0;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x123fbb;
      secp256k1_fe_verify(psVar17);
      psStackY_e78 = (secp256k1_fe *)0x123fc3;
      secp256k1_fe_verify(psVar17);
      sStackY_d70.n[0] = sStackY_d70.n[0] + 0x1c;
      sStackY_d70.magnitude = sStackY_d70.magnitude + 1;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x123fd7;
      secp256k1_fe_verify(psVar17);
      psStackY_e78 = (secp256k1_fe *)0x123fe7;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x123fef;
      secp256k1_fe_verify(psVar17);
      if (0x20 < sStackY_d70.magnitude + sStackY_d10.magnitude) goto LAB_00124491;
      sStackY_d10.n[0] = sStackY_d10.n[0] + sStackY_d70.n[0];
      sStackY_d10.n[1] = sStackY_d10.n[1] + sStackY_d70.n[1];
      sStackY_d10.n[2] = sStackY_d10.n[2] + sStackY_d70.n[2];
      sStackY_d10.n[3] = sStackY_d10.n[3] + sStackY_d70.n[3];
      sStackY_d10.n[4] =
           (long)(((secp256k1_ecmult_gen_context *)sStackY_d10.n[4])->scalar_offset).d +
           (sStackY_d70.n[4] - 8);
      sStackY_d10.normalized = 0;
      sStackY_d10.magnitude = sStackY_d70.magnitude + sStackY_d10.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x124051;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x124061;
      secp256k1_fe_mul(&sStackY_d10,&sStackY_d10,&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x124069;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x124076;
      secp256k1_fe_verify_magnitude(&sStackY_d10,1);
      sStackY_d10.n[0] = 0x3ffffbfffff0bc - sStackY_d10.n[0];
      sStackY_d10.n[1] = 0x3ffffffffffffc - sStackY_d10.n[1];
      sStackY_d10.n[2] = 0x3ffffffffffffc - sStackY_d10.n[2];
      sStackY_d10.n[3] = 0x3ffffffffffffc - sStackY_d10.n[3];
      psVar13 = (secp256k1_context *)(0x3fffffffffffc - sStackY_d10.n[4]);
      sStackY_d10.magnitude = 2;
      sStackY_d10.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x1240b4;
      sStackY_d10.n[4] = (uint64_t)psVar13;
      secp256k1_fe_verify(&sStackY_d10);
      psStackY_e78 = (secp256k1_fe *)0x1240bc;
      iVar3 = secp256k1_fe_is_square_var(&sStackY_d10);
      if (iVar3 == 0) {
        return;
      }
      psVar17 = &sStackY_d40;
      a = &sStackY_d10;
      psStackY_e78 = (secp256k1_fe *)0x1240d9;
      iVar3 = secp256k1_fe_sqrt(psVar17,a);
      psVar10 = psStackY_e68;
      if (iVar3 == 0) goto LAB_001244a0;
      psVar13 = (secp256k1_context *)0xffffefffffc2f;
      if ((uVar7 & 1) != 0) {
        psStackY_e78 = (secp256k1_fe *)0x12410a;
        secp256k1_fe_verify(&sStackY_d40);
        uVar6 = (sStackY_d40.n[4] >> 0x30) * 0x1000003d1 + sStackY_d40.n[0];
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar12 = (uVar6 >> 0x34) + sStackY_d40.n[1];
          uVar15 = (uVar12 >> 0x34) + sStackY_d40.n[2];
          uVar16 = (uVar15 >> 0x34) + sStackY_d40.n[3];
          uVar18 = (uVar16 >> 0x34) + (sStackY_d40.n[4] & 0xffffffffffff);
          if (((uVar12 | uVar6 | uVar15 | uVar16) & 0xfffffffffffff) == 0 && uVar18 == 0) {
            return;
          }
          if ((uVar6 + 0x1000003d0 & uVar12 & uVar15 & uVar16 & (uVar18 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
      }
      psStackY_e78 = (secp256k1_fe *)0x1241d5;
      secp256k1_fe_verify(&sStackY_e60);
      uVar6 = (sStackY_e60.n[4] >> 0x30) * 0x1000003d1 + sStackY_e60.n[0];
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar12 = (uVar6 >> 0x34) + sStackY_e60.n[1];
        uVar15 = (uVar12 >> 0x34) + sStackY_e60.n[2];
        uVar16 = (uVar15 >> 0x34) + sStackY_e60.n[3];
        uVar18 = (uVar16 >> 0x34) + (sStackY_e60.n[4] & 0xffffffffffff);
        if (((uVar12 | uVar6 | uVar15 | uVar16) & 0xfffffffffffff) == 0 && uVar18 == 0) {
          return;
        }
        if ((uVar6 + 0x1000003d0 & uVar12 & uVar15 & uVar16 & (uVar18 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_00 = &sStackY_da0;
      psStackY_e78 = (secp256k1_fe *)0x124291;
      secp256k1_fe_inv_var(a_00,&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x1242a4;
      a = a_00;
      secp256k1_fe_mul(a_00,a_00,&sStackY_d40);
      psStackY_e78 = (secp256k1_fe *)0x1242ac;
      secp256k1_fe_verify(a_00);
      psVar17 = &sStackY_e30;
      psStackY_e78 = (secp256k1_fe *)0x1242b9;
      secp256k1_fe_verify(psVar17);
      if (sStackY_e30.magnitude + sStackY_da0.magnitude < 0x21) {
        a_00 = &sStackY_da0;
        sStackY_da0.n[0] = sStackY_da0.n[0] + sStackY_e30.n[0];
        sStackY_da0.n[1] = sStackY_da0.n[1] + sStackY_e30.n[1];
        sStackY_da0.n[2] = sStackY_da0.n[2] + sStackY_e30.n[2];
        sStackY_da0.n[3] = sStackY_da0.n[3] + sStackY_e30.n[3];
        sStackY_da0.n[4] = sStackY_da0.n[4] + sStackY_e30.n[4];
        sStackY_da0.normalized = 0;
        sStackY_da0.magnitude = sStackY_e30.magnitude + sStackY_da0.magnitude;
        psStackY_e78 = (secp256k1_fe *)0x124311;
        secp256k1_fe_verify(a_00);
        psStackY_e78 = (secp256k1_fe *)0x124319;
        secp256k1_fe_half(a_00);
        goto LAB_00124319;
      }
      goto LAB_001244a5;
    }
    a_00 = &sStackY_e30;
    sStackY_e30.n[4] = sStackY_e00.n[4];
    sStackY_e30.magnitude = sStackY_e00.magnitude;
    sStackY_e30.normalized = sStackY_e00.normalized;
    sStackY_e30.n[2] = sStackY_e00.n[2];
    sStackY_e30.n[3] = sStackY_e00.n[3];
    sStackY_e30.n[0] = sStackY_e00.n[0];
    sStackY_e30.n[1] = sStackY_e00.n[1];
    psStackY_e78 = (secp256k1_fe *)0x123a4e;
    secp256k1_fe_verify(a_00);
    psVar17 = &sStackY_dd0;
    psStackY_e78 = (secp256k1_fe *)0x123a5e;
    secp256k1_fe_verify(psVar17);
    if (0x20 < sStackY_dd0.magnitude + sStackY_e30.magnitude) goto LAB_0012447d;
    sStackY_e30.n[0] = sStackY_e30.n[0] + sStackY_dd0.n[0];
    sStackY_e30.n[1] = sStackY_e30.n[1] + sStackY_dd0.n[1];
    sStackY_e30.n[2] = (long)(uint64_t *)sStackY_dd0.n[2] + sStackY_e30.n[2];
    sStackY_e30.n[3] = sStackY_e30.n[3] + sStackY_dd0.n[3];
    sStackY_e30.n[4] = sStackY_e30.n[4] + sStackY_dd0.n[4];
    sStackY_e30.normalized = 0;
    sStackY_e30.magnitude = sStackY_dd0.magnitude + sStackY_e30.magnitude;
    psStackY_e78 = (secp256k1_fe *)0x123abc;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x123ac4;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x123ad1;
    secp256k1_fe_verify_magnitude(&sStackY_e30,2);
    sStackY_e30.n[0] = 0x5ffff9ffffe91a - sStackY_e30.n[0];
    sStackY_e30.n[1] = 0x5ffffffffffffa - sStackY_e30.n[1];
    sStackY_e30.n[2] = 0x5ffffffffffffa - sStackY_e30.n[2];
    sStackY_e30.n[3] = 0x5ffffffffffffa - sStackY_e30.n[3];
    sStackY_e30.n[4] = 0x5fffffffffffa - sStackY_e30.n[4];
    sStackY_e30.magnitude = 3;
    sStackY_e30.normalized = 0;
    psStackY_e78 = (secp256k1_fe *)0x123b19;
    secp256k1_fe_verify(&sStackY_e30);
    psStackY_e78 = (secp256k1_fe *)0x123b21;
    iVar3 = secp256k1_ge_x_on_curve_var(&sStackY_e30);
    psVar13 = psStackY_e68;
    a_00 = (secp256k1_fe *)0x0;
    if (iVar3 != 0) {
      return;
    }
    psVar17 = &sStackY_e30;
    psStackY_e78 = (secp256k1_fe *)0x123b46;
    secp256k1_fe_sqr(&sStackY_e60,psVar17);
    psStackY_e78 = (secp256k1_fe *)0x123b4e;
    secp256k1_fe_verify(&sStackY_e60);
    psStackY_e78 = (secp256k1_fe *)0x123b5b;
    secp256k1_fe_verify_magnitude(&sStackY_e60,1);
    sStackY_e60.n[0] = 0x3ffffbfffff0bc - sStackY_e60.n[0];
    sStackY_e60.n[1] = 0x3ffffffffffffc - sStackY_e60.n[1];
    sStackY_e60.n[2] = 0x3ffffffffffffc - sStackY_e60.n[2];
    sStackY_e60.n[3] = 0x3ffffffffffffc - sStackY_e60.n[3];
    sStackY_e60.n[4] = 0x3fffffffffffc - sStackY_e60.n[4];
    sStackY_e60.magnitude = 2;
    sStackY_e60.normalized = 0;
    psStackY_e78 = (secp256k1_fe *)0x123ba3;
    secp256k1_fe_verify(&sStackY_e60);
    a = &sStackY_dd0;
    psStackY_e78 = (secp256k1_fe *)0x123bb8;
    secp256k1_fe_mul(psVar17,a,&sStackY_e00);
    psStackY_e78 = (secp256k1_fe *)0x123bc0;
    secp256k1_fe_verify(&sStackY_e60);
    psStackY_e78 = (secp256k1_fe *)0x123bc8;
    secp256k1_fe_verify(psVar17);
    if (sStackY_e30.magnitude + sStackY_e60.magnitude < 0x21) {
      sStackY_e60.n[0] = sStackY_e60.n[0] + sStackY_e30.n[0];
      sStackY_e60.n[1] = sStackY_e60.n[1] + sStackY_e30.n[1];
      sStackY_e60.n[2] = sStackY_e60.n[2] + sStackY_e30.n[2];
      sStackY_e60.n[3] = sStackY_e60.n[3] + sStackY_e30.n[3];
      sStackY_e60.n[4] = sStackY_e60.n[4] + sStackY_e30.n[4];
      sStackY_e60.normalized = 0;
      sStackY_e60.magnitude = sStackY_e30.magnitude + sStackY_e60.magnitude;
      psStackY_e78 = (secp256k1_fe *)0x123c1e;
      secp256k1_fe_verify(&sStackY_e60);
      psStackY_e78 = (secp256k1_fe *)0x123c26;
      secp256k1_fe_verify(&sStackY_e60);
      uVar6 = (sStackY_e60.n[4] >> 0x30) * 0x1000003d1 + sStackY_e60.n[0];
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar12 = (uVar6 >> 0x34) + sStackY_e60.n[1];
        a = (secp256k1_fe *)((uVar12 >> 0x34) + sStackY_e60.n[2]);
        psVar17 = (secp256k1_fe *)(((ulong)a >> 0x34) + sStackY_e60.n[3]);
        uVar15 = ((ulong)psVar17 >> 0x34) + (sStackY_e60.n[4] & 0xffffffffffff);
        if ((((uVar12 | uVar6 | (ulong)a | (ulong)psVar17) & 0xfffffffffffff) == 0 && uVar15 == 0)
           || ((uVar6 + 0x1000003d0 & uVar12 & (ulong)a & (ulong)psVar17 &
               (uVar15 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_001244af;
      }
      psStackY_e78 = (secp256k1_fe *)0x123cf2;
      secp256k1_fe_sqr(&sStackY_d70,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x123d00;
      secp256k1_fe_mul(&sStackY_d70,&sStackY_d70,&sStackY_dd0);
      psStackY_e78 = (secp256k1_fe *)0x123d08;
      secp256k1_fe_verify(&sStackY_d70);
      sStackY_d70.n[0] = sStackY_d70.n[0] + 7;
      sStackY_d70.magnitude = sStackY_d70.magnitude + 1;
      sStackY_d70.normalized = 0;
      psStackY_e78 = (secp256k1_fe *)0x123d20;
      secp256k1_fe_verify(&sStackY_d70);
      psStackY_e78 = (secp256k1_fe *)0x123d35;
      secp256k1_fe_mul(&sStackY_e30,&sStackY_e60,&sStackY_d70);
      psStackY_e78 = (secp256k1_fe *)0x123d3d;
      iVar3 = secp256k1_fe_is_square_var(&sStackY_e30);
      if (iVar3 == 0) {
        return;
      }
      a_00 = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x123d58;
      secp256k1_fe_inv_var(a_00,a_00);
      psStackY_e78 = (secp256k1_fe *)0x123d6b;
      secp256k1_fe_mul(a_00,a_00,&sStackY_d70);
      sStackY_da0.n[4] = sStackY_e00.n[4];
      sStackY_da0.magnitude = sStackY_e00.magnitude;
      sStackY_da0.normalized = sStackY_e00.normalized;
      sStackY_da0.n[2] = sStackY_e00.n[2];
      sStackY_da0.n[3] = sStackY_e00.n[3];
      sStackY_da0.n[0] = sStackY_e00.n[0];
      sStackY_da0.n[1] = sStackY_e00.n[1];
      psVar10 = psVar13;
LAB_00124319:
      psVar17 = &sStackY_e30;
      a = &sStackY_e60;
      psStackY_e78 = (secp256k1_fe *)0x124328;
      iVar3 = secp256k1_fe_sqrt(psVar17,a);
      if (iVar3 == 0) goto LAB_00124496;
      if (((uVar7 & 5) == 5) || ((uVar7 & 5) == 0)) {
        psStackY_e78 = (secp256k1_fe *)0x12434c;
        secp256k1_fe_verify(&sStackY_e30);
        psStackY_e78 = (secp256k1_fe *)0x124359;
        secp256k1_fe_verify_magnitude(&sStackY_e30,1);
        sStackY_e30.n[0] = 0x3ffffbfffff0bc - sStackY_e30.n[0];
        sStackY_e30.n[1] = 0x3ffffffffffffc - sStackY_e30.n[1];
        sStackY_e30.n[2] = 0x3ffffffffffffc - sStackY_e30.n[2];
        sStackY_e30.n[3] = 0x3ffffffffffffc - sStackY_e30.n[3];
        sStackY_e30.n[4] = 0x3fffffffffffc - sStackY_e30.n[4];
        sStackY_e30.magnitude = 2;
        sStackY_e30.normalized = 0;
        psStackY_e78 = (secp256k1_fe *)0x1243a1;
        secp256k1_fe_verify(&sStackY_e30);
      }
      psVar17 = &secp256k1_ellswift_c4;
      if ((uVar7 & 1) == 0) {
        psVar17 = &secp256k1_ellswift_c3;
      }
      a_00 = &sStackY_dd0;
      psStackY_e78 = (secp256k1_fe *)0x1243ca;
      a = a_00;
      secp256k1_fe_mul(a_00,a_00,psVar17);
      psStackY_e78 = (secp256k1_fe *)0x1243d2;
      secp256k1_fe_verify(a_00);
      psVar17 = &sStackY_da0;
      psStackY_e78 = (secp256k1_fe *)0x1243e2;
      secp256k1_fe_verify(psVar17);
      if (sStackY_da0.magnitude + sStackY_dd0.magnitude < 0x21) {
        sStackY_dd0.n[0] = sStackY_dd0.n[0] + sStackY_da0.n[0];
        sStackY_dd0.n[1] = sStackY_dd0.n[1] + sStackY_da0.n[1];
        sStackY_dd0.n[2] = (long)(uint64_t *)sStackY_dd0.n[2] + sStackY_da0.n[2];
        sStackY_dd0.n[3] = sStackY_dd0.n[3] + sStackY_da0.n[3];
        sStackY_dd0.n[4] = sStackY_dd0.n[4] + sStackY_da0.n[4];
        sStackY_dd0.normalized = 0;
        sStackY_dd0.magnitude = sStackY_da0.magnitude + sStackY_dd0.magnitude;
        psStackY_e78 = (secp256k1_fe *)0x124443;
        secp256k1_fe_verify(&sStackY_dd0);
        psStackY_e78 = (secp256k1_fe *)0x124453;
        secp256k1_fe_mul((secp256k1_fe *)psVar10,&sStackY_e30,&sStackY_dd0);
        return;
      }
      goto LAB_0012449b;
    }
  }
  psStackY_e78 = (secp256k1_fe *)0x1244af;
  secp256k1_ellswift_xswiftec_inv_var_cold_10();
LAB_001244af:
  psStackY_e78 = (secp256k1_fe *)fe_equal;
  secp256k1_ellswift_xswiftec_inv_var_cold_7();
  sStackY_eb8.n[0] = psVar17->n[0];
  sStackY_eb8.n[1] = psVar17->n[1];
  sStackY_eb8.n[2] = psVar17->n[2];
  sStackY_eb8.n[3] = psVar17->n[3];
  sStackY_eb8.n[4] = psVar17->n[4];
  sStackY_eb8.magnitude = psVar17->magnitude;
  sStackY_eb8.normalized = psVar17->normalized;
  sStackY_ee8.n[0] = a->n[0];
  sStackY_ee8.n[1] = a->n[1];
  sStackY_ee8.n[2] = a->n[2];
  sStackY_ee8.n[3] = a->n[3];
  sStackY_ee8.n[4] = a->n[4];
  sStackY_ee8.magnitude = a->magnitude;
  sStackY_ee8.normalized = a->normalized;
  psStackY_e80 = psVar13;
  psStackY_e78 = a_00;
  secp256k1_fe_verify(&sStackY_eb8);
  uVar12 = (sStackY_eb8.n[4] >> 0x30) * 0x1000003d1 + sStackY_eb8.n[0];
  uVar6 = (uVar12 >> 0x34) + sStackY_eb8.n[1];
  uVar15 = (uVar6 >> 0x34) + sStackY_eb8.n[2];
  uVar16 = (uVar15 >> 0x34) + sStackY_eb8.n[3];
  sStackY_eb8.n[3] = uVar16 & 0xfffffffffffff;
  sStackY_eb8.n[4] = (uVar16 >> 0x34) + (sStackY_eb8.n[4] & 0xffffffffffff);
  sStackY_eb8.n[2] = uVar15 & 0xfffffffffffff;
  sStackY_eb8.n[1] = uVar6 & 0xfffffffffffff;
  sStackY_eb8.n[0] = uVar12 & 0xfffffffffffff;
  sStackY_eb8.magnitude = 1;
  secp256k1_fe_verify(&sStackY_eb8);
  secp256k1_fe_equal(&sStackY_eb8,&sStackY_ee8);
  return;
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        testutil_random_ge_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        CHECK(secp256k1_ge_eq_var(&g, &g2));
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) testrand256_test(auxrnd32);
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        CHECK(secp256k1_gej_eq_ge_var(&res, &dec));
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        testrand256_test(ell64);
        testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        SECP256K1_FE_VERIFY(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            testrand256_test(prefix64);
            testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        testrand256_test(auxrnd32a);
        testrand256_test(auxrnd32b);
        testutil_random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        testutil_random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'e', 'n', 'c', 'o', 'd', 'e'};
        static const unsigned char create_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'c', 'r', 'e', 'a', 't', 'e'};
        static const unsigned char bip324_tag[] = {'b', 'i', 'p', '3', '2', '4', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'x', 'o', 'n', 'l', 'y', '_', 'e', 'c', 'd', 'h'};

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}